

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O3

void __thiscall
Catch::ReporterRegistrar<Catch::JunitReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::JunitReporter> *this,string *name)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  pSVar1 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_00->_M_use_count = 1;
  this_00->_M_weak_count = 1;
  this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001ad2f8;
  this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__IReporterFactory_001ad348;
  (*(pSVar1->super_RegistryHub).super_IMutableRegistryHub._vptr_IMutableRegistryHub[2])
            (&(pSVar1->super_RegistryHub).super_IMutableRegistryHub,name);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

explicit ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, std::make_shared<ReporterFactory>() );
        }